

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

int split_init(saucy *s,coloring *c,int cf,int ff)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  
  split_left(s,c,cf,ff);
  piVar2 = c->clen;
  if (piVar2[ff] != 0) {
    piVar3 = s->nextnon;
    piVar4 = s->prevnon;
    piVar4[piVar3[cf]] = ff;
    piVar3[ff] = piVar3[cf];
    piVar4[ff] = cf;
    piVar3[cf] = ff;
  }
  if (piVar2[cf] == 0) {
    piVar2 = s->prevnon;
    iVar1 = s->nextnon[cf];
    s->nextnon[piVar2[cf]] = iVar1;
    piVar2[iVar1] = piVar2[cf];
  }
  return 1;
}

Assistant:

static int
split_init(struct saucy *s, struct coloring *c, int cf, int ff)
{
    split_left(s, c, cf, ff);

    /* Maintain nonsingleton list for finding new targets */
    if (c->clen[ff]) {
        s->prevnon[s->nextnon[cf]] = ff;
        s->nextnon[ff] = s->nextnon[cf];
        s->prevnon[ff] = cf;
        s->nextnon[cf] = ff;
    }
    if (!c->clen[cf]) {
        s->nextnon[s->prevnon[cf]] = s->nextnon[cf];
        s->prevnon[s->nextnon[cf]] = s->prevnon[cf];
    }

    /* Always succeeds */
    return 1;
}